

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_transaction_context.cpp
# Opt level: O0

void __thiscall
TransactionContext_AddSign_Test::~TransactionContext_AddSign_Test
          (TransactionContext_AddSign_Test *this)

{
  void *in_RDI;
  
  ~TransactionContext_AddSign_Test((TransactionContext_AddSign_Test *)0x263698);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(TransactionContext, AddSign) {
  // P2wpkhMultisig
  TransactionContext ctx("02000000014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010100000000000000220020301e775bc1c43e8e032960fd0cd5b0009a3389b4f1b5a53072cde02559fa1d6e00000000");
  Script redeem_script("522102f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe53ae");

  Txid txid("ea9d5a9e974af1d167305aa6ee598706d63274e8a40f4f33af97db37a7adde4c");
  uint32_t vout = 0;

  std::vector<SignParameter> signatures;
  ByteData der_bytes1("47ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb");
  ByteData der_bytes2("30440220297e974e4728c6918cfa61f70cfb53d9b92e8a3b1e257003122bef7aecd500d002205d66d23e694fea18d1895a994f46ebd80474811a7509a67073b324f667dab2a601");
  signatures.push_back(SignParameter(ByteData()));
  signatures.push_back(SignParameter(der_bytes2, false));
  signatures.push_back(SignParameter(der_bytes1, true));
  signatures.push_back(SignParameter(redeem_script));
  signatures[1].SetRelatedPubkey(Pubkey("02f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef"));
  signatures[2].SetRelatedPubkey(Pubkey("02be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5"));

  EXPECT_NO_THROW(ctx.AddSign(OutPoint(txid, vout), signatures, true, true));

  EXPECT_STREQ(ctx.GetHex().c_str(), "020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010100000000000000220020301e775bc1c43e8e032960fd0cd5b0009a3389b4f1b5a53072cde02559fa1d6e04004730440220297e974e4728c6918cfa61f70cfb53d9b92e8a3b1e257003122bef7aecd500d002205d66d23e694fea18d1895a994f46ebd80474811a7509a67073b324f667dab2a601473044022047ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f0220217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb0169522102f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe53ae00000000");
}